

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  bool bVar1;
  iterator iVar2;
  fstream_t *pfVar3;
  key_type local_14;
  
  if (fs == (fstream_t *)0x0) {
    bVar1 = base::TypedConfigurations::toFile(this->m_typedConfigurations,level);
    if (!bVar1) {
      return;
    }
    pfVar3 = base::TypedConfigurations::fileStream(this->m_typedConfigurations,level);
    if (pfVar3 == (fstream_t *)0x0) {
      return;
    }
  }
  std::ostream::flush();
  iVar2 = base::utils::std::
          _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
          ::find(&(this->m_unflushedCount)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header) {
    *(undefined4 *)&iVar2._M_node[1].field_0x4 = 0;
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}